

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O3

bool Function_Template::form1_SetPixel(SetPixelForm1 SetPixel)

{
  uint8_t value;
  bool bVar1;
  uint uVar2;
  uint uVar3;
  vector<unsigned_char,_std::allocator<unsigned_char>_> intensity;
  Image image;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_90;
  Image local_78;
  ImageTemplate<unsigned_char> local_50;
  
  Unit_Test::intensityArray(&local_90,2);
  value = *local_90.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate(&local_50,0,0,'\x01','\x01');
  Test_Helper::uniformImage(&local_78,value,0,0,&local_50);
  local_50._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00215948;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_50);
  uVar2 = 0;
  uVar3 = 0;
  if (local_78._width != 0) {
    uVar2 = rand();
    uVar2 = uVar2 % local_78._width;
  }
  if (local_78._height != 0) {
    uVar3 = rand();
    uVar3 = uVar3 % local_78._height;
  }
  (*SetPixel)(&local_78,uVar2,uVar3,
              local_90.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start[1]);
  bVar1 = Unit_Test::verifyImage
                    (&local_78,uVar2,uVar3,1,1,
                     local_90.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start[1]);
  local_78._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00215948;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_78);
  if (local_90.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (uint8_t *)0x0) {
    operator_delete(local_90.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return bVar1;
}

Assistant:

bool form1_SetPixel(SetPixelForm1 SetPixel)
    {
        const std::vector < uint8_t > intensity = intensityArray( 2 );
        PenguinV_Image::Image image  = uniformImage( intensity[0] );
        const uint32_t x = randomValue<uint32_t>( 0, image.width() );
        const uint32_t y = randomValue<uint32_t>( 0, image.height() );

        SetPixel( image, x, y, intensity[1] );

        return verifyImage( image, x, y, 1, 1, intensity[1] );
    }